

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O1

void CVmBifTADS::toIntOrNum(uint argc,int int_only)

{
  vm_val_t *val_00;
  ushort *str;
  uint uVar1;
  vm_datatype_t vVar2;
  vm_val_t *pvVar3;
  int iVar4;
  int32_t iVar5;
  int iVar6;
  ushort *puVar7;
  ulong uVar8;
  long val_01;
  ushort *puVar9;
  ulong uVar10;
  vm_val_t val;
  vm_val_t local_40;
  
  CVmBif::check_argc_range(argc,1,2);
  pvVar3 = sp_;
  val_00 = sp_ + -1;
  if ((sp_[-1].typ == VM_OBJ) &&
     (iVar4 = (**(code **)(*(long *)&G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc]
                                     [sp_[-1].val.obj & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc] + (sp_[-1].val.obj & 0xfff),
                         CVmObjBigNum::metaclass_reg_), iVar4 != 0)) {
    if (int_only == 0) {
      CVmBif::retval(val_00);
      goto LAB_0022a8ef;
    }
    uVar1 = pvVar3[-1].val.obj;
    iVar5 = CVmObjBigNum::convert_to_int
                      ((CVmObjBigNum *)
                       ((long)&G_obj_table_X.pages_[uVar1 >> 0xc]->ptr_ +
                       (ulong)((uVar1 & 0xfff) * 0x18)));
    uVar8 = (ulong)iVar5;
  }
  else {
    vVar2 = val_00->typ;
    if (vVar2 - VM_NIL < 2) {
      uVar8 = (ulong)(vVar2 == VM_TRUE);
    }
    else {
      if (vVar2 != VM_INT) {
        puVar7 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
        if (puVar7 == (ushort *)0x0) {
          err_throw(0x7e3);
        }
        uVar8 = (ulong)*puVar7;
        iVar4 = 10;
        if (1 < argc) {
          if (sp_[-2].typ == VM_INT) {
            iVar4 = sp_[-2].val.intval;
          }
          else {
            iVar4 = vm_val_t::nonint_num_to_int(sp_ + -2);
          }
          if (iVar4 - 0x25U < 0xffffffdd) {
            err_throw(0x902);
          }
        }
        str = puVar7 + 1;
        uVar10 = uVar8;
        puVar9 = str;
        if (uVar8 != 0) {
          do {
            if (((char)*puVar9 < '\0') || (iVar6 = isspace((int)(char)*puVar9), iVar6 == 0))
            goto joined_r0x0022a9af;
            puVar9 = (ushort *)((long)puVar9 + 1);
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
          uVar10 = 0;
          puVar9 = (ushort *)((long)puVar7 + uVar8 + 2);
        }
joined_r0x0022a9af:
        do {
          if (uVar10 == 0) goto LAB_0022a9ff;
          iVar6 = (int)*(char *)((long)puVar9 + (uVar10 - 1));
          if ((iVar6 < 0) || (iVar6 = isspace(iVar6), iVar6 == 0)) {
            if (uVar10 == 4) {
              if (*(int *)puVar9 != 0x65757274) goto LAB_0022a9ff;
              val_01 = 1;
            }
            else {
              if ((uVar10 != 3) || ((char)puVar9[1] != 'l' || *puVar9 != 0x696e)) goto LAB_0022a9ff;
              val_01 = 0;
            }
            CVmBif::retval_int(val_01);
            goto LAB_0022a8ef;
          }
          uVar10 = uVar10 - 1;
        } while( true );
      }
      uVar8 = (ulong)pvVar3[-1].val.intval;
    }
  }
  CVmBif::retval_int(uVar8);
LAB_0022a8ef:
  sp_ = sp_ + -(long)(int)argc;
  return;
LAB_0022a9ff:
  CVmObjString::parse_num_val(&local_40,(char *)str,uVar8,iVar4,int_only);
  CVmBif::retval(&local_40);
  goto LAB_0022a8ef;
}

Assistant:

void CVmBifTADS::toIntOrNum(VMG_ uint argc, int int_only)
{    
    /* check arguments */
    check_argc_range(vmg_ argc, 1, 2);

    /* check for BigNumber values */
    vm_val_t *valp = G_stk->get(0);
    if (valp->typ == VM_OBJ
        && CVmObjBigNum::is_bignum_obj(vmg_ valp->val.obj))
    {
        /*
         *   If we only want integer results, try converting the BigNumber to
         *   an integer.  Otherwise, simply return the BigNumber as-is. 
         */
        if (int_only)
        {
            /* we only want an integer result - convert to int */
            long intval = ((CVmObjBigNum *)vm_objp(vmg_ valp->val.obj))
                          ->convert_to_int();

            /* return the integer value */
            retval_int(vmg_ intval);
        }
        else
        {
            /* BigNumber results are okay - just return the BigNumber */
            retval(vmg_ valp);
        }
        
        /* discard arguments, and we're done */
        G_stk->discard(argc);
        return;
    }

    /* if it's already an integer, just return the same value */
    if (valp->typ == VM_INT)
    {
        /* just return the argument value */
        retval_int(vmg_ valp->val.intval);

        /* discard arguments and return */
        G_stk->discard(argc);
        return;
    }

    /* if it's true or nil, convert to 1 or 0 */
    if (valp->typ == VM_TRUE || valp->typ == VM_NIL)
    {
        /* return 1 for true, 0 for nil */
        retval_int(vmg_ valp->typ == VM_TRUE ? 1 : 0);
        G_stk->discard(argc);
        return;
    }

    /* the only other type of value we can convert is a string */
    const char *strp = G_stk->get(0)->get_as_string(vmg0_);
    if (strp == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get the string length and buffer pointer */
    size_t len = vmb_get_len(strp);
    strp += VMB_LEN;

    /* if there's a radix specified, pop it as well; the default is 10 */
    int radix = 10;
    if (argc >= 2)
    {
        /* get the radix from the stack */
        radix = G_stk->get(1)->num_to_int(vmg0_);

        /* make sure it's in the valid range */
        if (radix < 2 || radix > 36)
            err_throw(VMERR_BAD_VAL_BIF);
    }

    /* get a version of the string stripped of leading and trailing spaces */
    const char *p2 = strp;
    size_t len2 = len;
    for ( ; len2 != 0 && is_space(*p2) ; ++p2, --len2) ;
    for ( ; len2 != 0 && is_space(*(p2 + len2 - 1)) ; --len2) ;

    /* 
     *   Check for "nil" and "true", ignoring leading and trailing spaces; if
     *   it matches either of those, return the corresponding boolean value.
     *   Otherwise, parse the string as an integer value in the given radix.
     */
    if (len2 == 3 && memcmp(p2, "nil", 3) == 0)
    {
        /* the value for "nil" is 0 */
        retval_int(vmg_ 0);
    }
    else if (len2 == 4 && memcmp(p2, "true", 4) == 0)
    {
        /* the value for "true" is 1 */
        retval_int(vmg_ 1);
    }
    else
    {
        /* parse the string as an integer (orBigNumber if it's too large) */
        vm_val_t val;
        CVmObjString::parse_num_val(vmg_ &val, strp, len, radix, int_only);
        retval(vmg_ &val);
    }

    /* discard arguments */
    G_stk->discard(argc);
}